

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<unsigned_int,_std::allocator<unsigned_int>_> *buf)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  reference puVar4;
  uint *b;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  bool first;
  ios local_128 [8];
  ios state;
  char_type fillchar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *buf_local;
  ostream *os_local;
  
  cVar2 = std::ios::fill();
  std::ios::ios(local_128,(streambuf *)0x0);
  std::ios::copyfmt(local_128);
  bVar1 = true;
  __end0 = vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(buf);
  b = (uint *)vector<unsigned_int,_std::allocator<unsigned_int>_>::end(buf);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      (&__end0,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&b);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    std::ios::copyfmt((ios *)(os + *(long *)(*(long *)os + -0x18)));
    if ((!bVar1) && (cVar2 != '\0')) {
      std::operator<<(os,cVar2);
    }
    std::ostream::operator<<(os,*puVar4);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  std::ios::~ios(local_128);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const std::vector<T, A>& buf)
{
    auto fillchar = os.fill();
    std::ios state(NULL);  state.copyfmt(os);

    bool first= true;
    for (const auto& b : buf) {
        os.copyfmt(state);
        if (!first && fillchar) os << fillchar;
        if constexpr (std::is_integral_v<T> && sizeof(T)==1) {
            // This makes sure the numbers in byte and char vectors are printed 
            // as numbers, instead of as characters.
            os << +b;
        }
        else {
            os << b;
        }
        first= false;
    }
    return os;
}